

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGGrindReader.cpp
# Opt level: O3

void __thiscall CFGGrindReader::~CFGGrindReader(CFGGrindReader *this)

{
  pointer pcVar1;
  
  (this->super_CFGReader)._vptr_CFGReader = (_func_int **)&PTR__CFGGrindReader_0012aa78;
  (this->m_current)._vptr_Lexeme = (_func_int **)&PTR__Lexeme_0012aa08;
  pcVar1 = (this->m_current).token._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->m_current).token.field_2) {
    operator_delete(pcVar1);
  }
  InputTokenizer::~InputTokenizer(&this->m_tokens);
  CFGReader::~CFGReader(&this->super_CFGReader);
  return;
}

Assistant:

CFGGrindReader::~CFGGrindReader() {
}